

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGPlanner.cpp
# Opt level: O0

void __thiscall
PerseusBGPlanner::PerseusBGPlanner
          (PerseusBGPlanner *this,PlanningUnitDecPOMDPDiscrete *pu,QAVParameters *params)

{
  long in_RDX;
  PlanningUnitDecPOMDPDiscrete *in_RDI;
  PlanningUnitDecPOMDPDiscrete *in_stack_000000a8;
  AlphaVectorPlanning *in_stack_000000b0;
  AlphaVectorPlanning *in_stack_000005b0;
  void **in_stack_ffffffffffffffd8;
  PerseusQFunctionPlanner *in_stack_ffffffffffffffe0;
  
  AlphaVectorPlanning::AlphaVectorPlanning(in_stack_000000b0,in_stack_000000a8);
  AlphaVectorBG::AlphaVectorBG
            (&this->super_AlphaVectorBG,(void **)pu,(PlanningUnitDecPOMDPDiscrete *)params);
  PerseusQFunctionPlanner::PerseusQFunctionPlanner
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit =
       (_func_int **)&PTR__PerseusBGPlanner_00d0f990;
  (in_RDI->super_PlanningUnitMADPDiscrete)._m_nrActionHistoriesT.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__PerseusBGPlanner_00d0fa58;
  (in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon =
       (size_t)&PTR_GetImmediateRewardBeliefSet_00d0f9c8;
  *(undefined4 *)&(in_RDI->super_PlanningUnitMADPDiscrete)._m_nrJointActionHistories =
       *(undefined4 *)(in_RDX + 0x14);
  AlphaVectorPlanning::Initialize(in_stack_000005b0);
  Perseus::Initialize((Perseus *)
                      &(in_RDI->super_PlanningUnitMADPDiscrete).super_PlanningUnit._m_horizon);
  return;
}

Assistant:

PerseusBGPlanner::PerseusBGPlanner(const PlanningUnitDecPOMDPDiscrete* pu,
                                   const QAVParameters& params) :
    AlphaVectorPlanning(pu),
    AlphaVectorBG(pu),
    PerseusQFunctionPlanner(pu),
    _m_backupType(params.bgBackupType)
{
    AlphaVectorPlanning::Initialize();
    Perseus::Initialize();
}